

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# certificate.cc
# Opt level: O1

unique_ptr<bssl::Certificate,_std::default_delete<bssl::Certificate>_>
bssl::Certificate::FromDER(Span<const_unsigned_char> der,string *out_diagnostic)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  _Alloc_hider _Var1;
  undefined8 *puVar2;
  string *in_RCX;
  __uniq_ptr_data<bssl::Certificate,_std::default_delete<bssl::Certificate>,_true,_true> _Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  ParsedCertificate *__tmp;
  _Head_base<0UL,_crypto_buffer_st_*,_false> _Var4;
  UniquePtr<CRYPTO_BUFFER> buffer;
  __single_object internals;
  CertErrors errors;
  ParseCertificateOptions local_71;
  __uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter> local_70;
  undefined1 local_68 [24];
  string local_50;
  CertErrors local_30;
  
  _Var3.super___uniq_ptr_impl<bssl::Certificate,_std::default_delete<bssl::Certificate>_>._M_t.
  super__Tuple_impl<0UL,_bssl::Certificate_*,_std::default_delete<bssl::Certificate>_>.
  super__Head_base<0UL,_bssl::Certificate_*,_false>._M_head_impl =
       (__uniq_ptr_impl<bssl::Certificate,_std::default_delete<bssl::Certificate>_>)der.data_;
  local_71.allow_invalid_serial_numbers = true;
  local_70._M_t.super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl =
       (tuple<crypto_buffer_st_*,_bssl::internal::Deleter>)
       CRYPTO_BUFFER_new((uint8_t *)der.size_,(size_t)out_diagnostic,(CRYPTO_BUFFER_POOL *)0x0);
  CertErrors::CertErrors(&local_30);
  local_68._16_8_ =
       local_70._M_t.super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl;
  local_70._M_t.super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl =
       (tuple<crypto_buffer_st_*,_bssl::internal::Deleter>)
       (_Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>)0x0;
  ParsedCertificate::Create
            ((ParsedCertificate *)local_68,(UniquePtr<CRYPTO_BUFFER> *)(local_68 + 0x10),&local_71,
             &local_30);
  ::std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)(local_68 + 0x10));
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_;
  _Var4._M_head_impl = (crypto_buffer_st *)local_68._0_8_;
  if ((crypto_buffer_st *)local_68._0_8_ == (crypto_buffer_st *)0x0) {
    CertErrors::ToDebugString_abi_cxx11_((string *)(local_68 + 0x18),&local_30);
    ::std::__cxx11::string::operator=(in_RCX,(string *)(local_68 + 0x18));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,(ulong)(local_50.field_2._M_allocated_capacity + 1))
      ;
    }
    _Var4._M_head_impl = (crypto_buffer_st *)0x0;
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    local_68._0_8_ = (crypto_buffer_st *)0x0;
    local_68._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
  }
  CertErrors::~CertErrors(&local_30);
  ::std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)&local_70);
  if (_Var4._M_head_impl == (crypto_buffer_st *)0x0) {
    *(undefined8 *)
     _Var3.super___uniq_ptr_impl<bssl::Certificate,_std::default_delete<bssl::Certificate>_>._M_t.
     super__Tuple_impl<0UL,_bssl::Certificate_*,_std::default_delete<bssl::Certificate>_>.
     super__Head_base<0UL,_bssl::Certificate_*,_false>._M_head_impl = 0;
  }
  else {
    local_50._M_dataplus._M_p = (pointer)operator_new(0x10);
    *(long *)local_50._M_dataplus._M_p = 0;
    *(long *)((long)local_50._M_dataplus._M_p + 8) = 0;
    *(crypto_buffer_st **)local_50._M_dataplus._M_p = _Var4._M_head_impl;
    this = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_50._M_dataplus._M_p + 8);
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_50._M_dataplus._M_p + 8) =
         this_00;
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
    }
    puVar2 = (undefined8 *)operator_new(8);
    _Var1._M_p = local_50._M_dataplus._M_p;
    local_50._M_dataplus._M_p = (pointer)0x0;
    *puVar2 = _Var1._M_p;
    *(undefined8 **)
     _Var3.super___uniq_ptr_impl<bssl::Certificate,_std::default_delete<bssl::Certificate>_>._M_t.
     super__Tuple_impl<0UL,_bssl::Certificate_*,_std::default_delete<bssl::Certificate>_>.
     super__Head_base<0UL,_bssl::Certificate_*,_false>._M_head_impl = puVar2;
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return (__uniq_ptr_data<bssl::Certificate,_std::default_delete<bssl::Certificate>,_true,_true>)
         (tuple<bssl::Certificate_*,_std::default_delete<bssl::Certificate>_>)
         _Var3.super___uniq_ptr_impl<bssl::Certificate,_std::default_delete<bssl::Certificate>_>.
         _M_t.super__Tuple_impl<0UL,_bssl::Certificate_*,_std::default_delete<bssl::Certificate>_>.
         super__Head_base<0UL,_bssl::Certificate_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<Certificate> Certificate::FromDER(bssl::Span<const uint8_t> der,
                                                  std::string *out_diagnostic) {
  std::shared_ptr<const bssl::ParsedCertificate> result =
      ParseCertificateFromDer(der, out_diagnostic);
  if (result == nullptr) {
    return nullptr;
  }

  auto internals = std::make_unique<CertificateInternals>();
  internals->cert = std::move(result);
  std::unique_ptr<Certificate> ret(new Certificate(std::move(internals)));
  return ret;
}